

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libskiwi.cpp
# Opt level: O0

argtype skiwi::anon_unknown_1::_convert(external_type t)

{
  argtype local_c;
  external_type t_local;
  
  switch(t) {
  case skiwi_bool:
    local_c = T_BOOL;
    break;
  case skiwi_char_pointer:
    local_c = T_CHAR_POINTER;
    break;
  case skiwi_double:
    local_c = T_DOUBLE;
    break;
  case skiwi_int64:
    local_c = T_INT64;
    break;
  case skiwi_void:
    local_c = T_VOID;
    break;
  case skiwi_scm:
    local_c = T_SCM;
    break;
  default:
    local_c = T_VOID;
  }
  return local_c;
}

Assistant:

external_function::argtype _convert(external_type t)
    {
    switch (t)
      {
      case skiwi_bool: return external_function::T_BOOL;
      case skiwi_char_pointer: return external_function::T_CHAR_POINTER;
      case skiwi_double: return external_function::T_DOUBLE;
      case skiwi_int64: return external_function::T_INT64;
      case skiwi_void: return external_function::T_VOID;
      case skiwi_scm: return external_function::T_SCM;
      }
    return external_function::T_VOID;
    }